

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O3

void __thiscall libsbox::BindRule::BindRule(BindRule *this,string *inside,string *outside,int flags)

{
  pointer pcVar1;
  
  (this->inside_)._M_dataplus._M_p = (pointer)&(this->inside_).field_2;
  pcVar1 = (inside->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + inside->_M_string_length)
  ;
  (this->outside_)._M_dataplus._M_p = (pointer)&(this->outside_).field_2;
  pcVar1 = (outside->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->outside_,pcVar1,pcVar1 + outside->_M_string_length);
  this->flags_ = flags;
  return;
}

Assistant:

BindRule::BindRule(const std::string &inside, const std::string &outside, int flags)
    : inside_(inside), outside_(outside), flags_(flags) {}